

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoGeometry.cpp
# Opt level: O2

void __thiscall
HACD::MyAutoGeometry::addBones
          (MyAutoGeometry *this,SimpleSkinnedVertex *v,HaU32 *bones,HaU32 *bcount,SimpleBone *sbones
          )

{
  if (*(float *)(sbones + (ulong)v->mBone[0] * 0x98 + 0x14) <= (float)v->mWeight[0]) {
    addBone(this,(uint)v->mBone[0],bones,bcount);
  }
  if (*(float *)(sbones + (ulong)v->mBone[1] * 0x98 + 0x14) <= (float)v->mWeight[1]) {
    addBone(this,(uint)v->mBone[1],bones,bcount);
  }
  if (*(float *)(sbones + (ulong)v->mBone[2] * 0x98 + 0x14) <= (float)v->mWeight[2]) {
    addBone(this,(uint)v->mBone[2],bones,bcount);
  }
  if ((float)v->mWeight[3] < *(float *)(sbones + (ulong)v->mBone[3] * 0x98 + 0x14)) {
    return;
  }
  addBone(this,(uint)v->mBone[3],bones,bcount);
  return;
}

Assistant:

void addBones(const HACD::SimpleSkinnedVertex &v,hacd::HaU32 *bones,hacd::HaU32 &bcount, const HACD::SimpleBone *sbones)
		{
			if ( v.mWeight[0] >= sbones[v.mBone[0]].mBoneMinimalWeight) addBone(v.mBone[0],bones,bcount);
			if ( v.mWeight[1] >= sbones[v.mBone[1]].mBoneMinimalWeight) addBone(v.mBone[1],bones,bcount);
			if ( v.mWeight[2] >= sbones[v.mBone[2]].mBoneMinimalWeight) addBone(v.mBone[2],bones,bcount);
			if ( v.mWeight[3] >= sbones[v.mBone[3]].mBoneMinimalWeight) addBone(v.mBone[3],bones,bcount);
		}